

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPart.c
# Opt level: O3

uint * Abc_NtkSuppCharStart(Vec_Int_t *vOne,int nPis)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  uint *puVar4;
  long lVar5;
  
  puVar4 = (uint *)calloc(1,(long)(int)(((nPis >> 5) + 1) - (uint)((nPis & 0x1fU) == 0)) << 2);
  iVar1 = vOne->nSize;
  if (0 < (long)iVar1) {
    piVar3 = vOne->pArray;
    lVar5 = 0;
    do {
      iVar2 = piVar3[lVar5];
      if (nPis <= iVar2) {
        __assert_fail("Entry < nPis",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcPart.c"
                      ,0x1db,"unsigned int *Abc_NtkSuppCharStart(Vec_Int_t *, int)");
      }
      puVar4[iVar2 >> 5] = puVar4[iVar2 >> 5] | 1 << ((byte)iVar2 & 0x1f);
      lVar5 = lVar5 + 1;
    } while (iVar1 != lVar5);
  }
  return puVar4;
}

Assistant:

unsigned * Abc_NtkSuppCharStart( Vec_Int_t * vOne, int nPis )
{
    unsigned * pBuffer;
    int i, Entry;
    int nWords = Abc_BitWordNum(nPis);
    pBuffer = ABC_ALLOC( unsigned, nWords );
    memset( pBuffer, 0, sizeof(unsigned) * nWords );
    Vec_IntForEachEntry( vOne, Entry, i )
    {
        assert( Entry < nPis );
        Abc_InfoSetBit( pBuffer, Entry );
    }
    return pBuffer;
}